

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ieee.cc
# Opt level: O1

void TestSingle_IsDenormal(void)

{
  return;
}

Assistant:

TEST(Single_IsDenormal) {
  uint32_t min_float32 = 0x00000001;
  CHECK(Single(min_float32).IsDenormal());
  uint32_t bits = 0x007FFFFF;
  CHECK(Single(bits).IsDenormal());
  bits = 0x00800000;
  CHECK(!Single(bits).IsDenormal());
}